

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktCheck.cpp
# Opt level: O3

void __thiscall KktCheck::chPrimalBounds(KktCheck *this)

{
  double dVar1;
  int iVar2;
  ostream *poVar3;
  int iVar4;
  
  this->i = 0;
  iVar2 = this->numCol;
  if (0 < iVar2) {
    iVar4 = 0;
    do {
      dVar1 = (this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar4];
      if ((this->tol <
           (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[iVar4] - dVar1) ||
         (this->tol <
          dVar1 - (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar4])) {
        if (this->print == 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Variable ",9);
          poVar3 = (ostream *)
                   std::ostream::operator<<
                             ((ostream *)&std::cout,
                              (this->cIndexRev).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start[this->i]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," infeasible: lb=",0x10);
          poVar3 = std::ostream::_M_insert<double>
                             ((this->colLower).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start[this->i]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,", vaule=",8);
          poVar3 = std::ostream::_M_insert<double>
                             ((this->colValue).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start[this->i]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,",  ub=",6);
          poVar3 = std::ostream::_M_insert<double>
                             ((this->colUpper).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start[this->i]);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          iVar2 = this->numCol;
          iVar4 = this->i;
        }
        this->istrueGlb = true;
      }
      iVar4 = iVar4 + 1;
      this->i = iVar4;
    } while (iVar4 < iVar2);
  }
  return;
}

Assistant:

void KktCheck::chPrimalBounds() {
	for (i=0; i<numCol;i++) {
		if ((colLower[i] - colValue[i] > tol) ||  (colValue[i]- colUpper[i] > tol) ) {
			if (print == 1) 
				cout<<"Variable "<<cIndexRev[i]<<" infeasible: lb="<<colLower[i]<<", vaule="<<colValue[i]<<",  ub="<<colUpper[i]<<endl;
				//cout<<"Variable "<<i<<" infeasible: lb="<<colLower[i]<<", vaule="<<colValue[i]<<",  ub="<<colUpper[i]<<endl;
			istrueGlb = true;
		}
	}
}